

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O0

ggml_tensor *
ggml_conv_transpose_1d(ggml_context *ctx,ggml_tensor *a,ggml_tensor *b,int s0,int p0,int d0)

{
  _Bool _Var1;
  ggml_tensor *pgVar2;
  int in_ECX;
  ggml_tensor *in_RDX;
  ggml_tensor *in_RSI;
  int in_R8D;
  int in_R9D;
  int32_t params [3];
  ggml_tensor *result;
  int64_t ne [4];
  int in_stack_ffffffffffffff98;
  ggml_type in_stack_ffffffffffffff9c;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  
  _Var1 = ggml_is_matrix(in_RDX);
  if (!_Var1) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml.c",0xf7f
               ,"GGML_ASSERT(%s) failed","ggml_is_matrix(b)");
  }
  if (in_RSI->ne[2] != in_RDX->ne[1]) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml.c",0xf80
               ,"GGML_ASSERT(%s) failed","a->ne[2] == b->ne[1]");
  }
  if (in_RSI->ne[3] != 1) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml.c",0xf81
               ,"GGML_ASSERT(%s) failed","a->ne[3] == 1");
  }
  if (in_R8D != 0) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml.c",0xf83
               ,"GGML_ASSERT(%s) failed","p0 == 0");
  }
  if (in_R9D != 1) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml.c",0xf84
               ,"GGML_ASSERT(%s) failed","d0 == 1");
  }
  ggml_calc_conv_transpose_1d_output_size(in_RDX->ne[0],in_RSI->ne[0],in_ECX,0,1);
  pgVar2 = ggml_new_tensor((ggml_context *)
                           CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                           in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98,(int64_t *)0x1507e5);
  ggml_set_op_params((ggml_tensor *)CONCAT44(in_ECX,in_stack_ffffffffffffffa0),
                     (void *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),0x150816)
  ;
  pgVar2->op = GGML_OP_CONV_TRANSPOSE_1D;
  pgVar2->src[0] = in_RSI;
  pgVar2->src[1] = in_RDX;
  return pgVar2;
}

Assistant:

ggml_tensor * ggml_conv_transpose_1d(
        struct ggml_context * ctx,
        struct ggml_tensor  * a,
        struct ggml_tensor  * b,
        int                   s0,
        int                   p0,
        int                   d0) {
    GGML_ASSERT(ggml_is_matrix(b));
    GGML_ASSERT(a->ne[2] == b->ne[1]);
    GGML_ASSERT(a->ne[3] == 1);

    GGML_ASSERT(p0 == 0);
    GGML_ASSERT(d0 == 1);

    const int64_t ne[4] = {
        ggml_calc_conv_transpose_1d_output_size(b->ne[0], a->ne[0], s0, 0 /*p0*/, 1 /*d0*/),
        a->ne[1], b->ne[2], 1,
    };
    struct ggml_tensor * result = ggml_new_tensor(ctx, GGML_TYPE_F32, 4, ne);

    int32_t params[] = { s0, p0, d0 };
    ggml_set_op_params(result, params, sizeof(params));

    result->op     = GGML_OP_CONV_TRANSPOSE_1D;
    result->src[0] = a;
    result->src[1] = b;

    return result;
}